

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

vector<UniValue,_std::allocator<UniValue>_> *
common::GetSettingsList
          (Settings *settings,string *section,string *name,bool ignore_default_section_config)

{
  Settings *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  vector<UniValue,_std::allocator<UniValue>_> *result;
  bool prev_negated_empty;
  bool done;
  vector<UniValue,_std::allocator<UniValue>_> *in_stack_ffffffffffffff78;
  Settings *pSVar1;
  undefined1 local_b [2];
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = in_R8B & 1;
  pSVar1 = in_RDI;
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(in_stack_ffffffffffffff78);
  local_b[1] = 0;
  local_b[0] = 0;
  (anonymous_namespace)::
  MergeSettings<common::GetSettingsList(common::Settings_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool)::__0>
            (in_RDI,(string *)(local_b + 1),(string *)&stack0xfffffffffffffff7,
             (anon_class_32_4_dac78d21 *)local_b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (vector<UniValue,_std::allocator<UniValue>_> *)pSVar1;
}

Assistant:

std::vector<SettingsValue> GetSettingsList(const Settings& settings,
    const std::string& section,
    const std::string& name,
    bool ignore_default_section_config)
{
    std::vector<SettingsValue> result;
    bool done = false; // Done merging any more settings sources.
    bool prev_negated_empty = false;
    MergeSettings(settings, section, name, [&](SettingsSpan span, Source source) {
        // Weird behavior preserved for backwards compatibility: Apply config
        // file settings even if negated on command line. Negating a setting on
        // command line will ignore earlier settings on the command line and
        // ignore settings in the config file, unless the negated command line
        // value is followed by non-negated value, in which case config file
        // settings will be brought back from the dead (but earlier command
        // line settings will still be ignored).
        const bool add_zombie_config_values =
            (source == Source::CONFIG_FILE_NETWORK_SECTION || source == Source::CONFIG_FILE_DEFAULT_SECTION) &&
            !prev_negated_empty;

        // Ignore settings in default config section if requested.
        if (ignore_default_section_config && source == Source::CONFIG_FILE_DEFAULT_SECTION) return;

        // Add new settings to the result if isn't already complete, or if the
        // values are zombies.
        if (!done || add_zombie_config_values) {
            for (const auto& value : span) {
                if (value.isArray()) {
                    result.insert(result.end(), value.getValues().begin(), value.getValues().end());
                } else {
                    result.push_back(value);
                }
            }
        }

        // If a setting was negated, or if a setting was forced, set
        // done to true to ignore any later lower priority settings.
        done |= span.negated() > 0 || source == Source::FORCED;

        // Update the negated and empty state used for the zombie values check.
        prev_negated_empty |= span.last_negated() && result.empty();
    });
    return result;
}